

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

void __thiscall
cmsys::Glob::ProcessDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long uVar3;
  char *pcVar4;
  reference this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string fname;
  string realname;
  unsigned_long cc;
  Directory local_38;
  Directory d;
  bool last;
  GlobMessages *messages_local;
  string *dir_local;
  size_type start_local;
  Glob *this_local;
  
  sVar2 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::size
                    (&this->Internals->Expressions);
  d.Internal._7_1_ = start == sVar2 - 1;
  if (((bool)d.Internal._7_1_) && ((this->Recurse & 1U) != 0)) {
    RecurseDirectory(this,start,dir,messages);
  }
  else {
    sVar2 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::size
                      (&this->Internals->Expressions);
    if (start < sVar2) {
      Directory::Directory(&local_38);
      bVar1 = Directory::Load(&local_38,dir);
      if (bVar1) {
        std::__cxx11::string::string((string *)(fname.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_90);
        for (realname.field_2._8_8_ = 0; uVar3 = Directory::GetNumberOfFiles(&local_38),
            (ulong)realname.field_2._8_8_ < uVar3;
            realname.field_2._8_8_ = realname.field_2._8_8_ + 1) {
          pcVar4 = Directory::GetFile(&local_38,realname.field_2._8_8_);
          std::__cxx11::string::operator=((string *)local_90,pcVar4);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,".");
          if ((!bVar1) &&
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_90,".."), !bVar1)) {
            if (start == 0) {
              std::operator+(&local_b0,dir,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90);
              std::__cxx11::string::operator=
                        ((string *)(fname.field_2._M_local_buf + 8),(string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
            }
            else {
              std::operator+(&local_f0,dir,"/");
              std::operator+(&local_d0,&local_f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90);
              std::__cxx11::string::operator=
                        ((string *)(fname.field_2._M_local_buf + 8),(string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_f0);
            }
            if ((((d.Internal._7_1_ & 1) != 0) ||
                (bVar1 = SystemTools::FileIsDirectory((string *)((long)&fname.field_2 + 8)), bVar1))
               && (((this->ListDirs & 1U) != 0 ||
                   (((d.Internal._7_1_ & 1) == 0 ||
                    (bVar1 = SystemTools::FileIsDirectory((string *)((long)&fname.field_2 + 8)),
                    !bVar1)))))) {
              this_00 = std::
                        vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        ::operator[](&this->Internals->Expressions,start);
              bVar1 = RegularExpression::find(this_00,(string *)local_90);
              if (bVar1) {
                if ((d.Internal._7_1_ & 1) == 0) {
                  ProcessDirectory(this,start + 1,(string *)((long)&fname.field_2 + 8),messages);
                }
                else {
                  AddFile(this,&this->Internals->Files,(string *)((long)&fname.field_2 + 8));
                }
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
      }
      Directory::~Directory(&local_38);
    }
  }
  return;
}

Assistant:

void Glob::ProcessDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  // std::cout << "ProcessDirectory: " << dir << std::endl;
  bool last = (start == this->Internals->Expressions.size() - 1);
  if (last && this->Recurse) {
    this->RecurseDirectory(start, dir, messages);
    return;
  }

  if (start >= this->Internals->Expressions.size()) {
    return;
  }

  kwsys::Directory d;
  if (!d.Load(dir)) {
    return;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On case-insensitive file systems convert to lower case for matching.
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    // std::cout << "Look at file: " << fname << std::endl;
    // std::cout << "Match: "
    // << this->Internals->TextExpressions[start].c_str() << std::endl;
    // std::cout << "Real name: " << realname << std::endl;

    if ((!last && !kwsys::SystemTools::FileIsDirectory(realname)) ||
        (!this->ListDirs && last &&
         kwsys::SystemTools::FileIsDirectory(realname))) {
      continue;
    }

    if (this->Internals->Expressions[start].find(fname)) {
      if (last) {
        this->AddFile(this->Internals->Files, realname);
      } else {
        this->ProcessDirectory(start + 1, realname, messages);
      }
    }
  }
}